

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_info_base.hpp
# Opt level: O1

void * asio::detail::thread_info_base::allocate<asio::detail::thread_info_base::default_tag>
                 (undefined8 *param_1,long param_2)

{
  ulong uVar1;
  byte *pbVar2;
  void *pvVar3;
  void *pointer;
  undefined1 uVar4;
  
  uVar1 = param_2 + 3;
  if ((param_1 != (undefined8 *)0x0) && (pbVar2 = (byte *)*param_1, pbVar2 != (byte *)0x0)) {
    *param_1 = 0;
    if (uVar1 >> 2 <= (ulong)*pbVar2) {
      pbVar2[param_2] = *pbVar2;
      return pbVar2;
    }
    operator_delete(pbVar2);
  }
  pvVar3 = operator_new((uVar1 & 0xfffffffffffffffc) + 1);
  uVar4 = (undefined1)(uVar1 >> 2);
  if (0x3ff < uVar1) {
    uVar4 = 0;
  }
  *(undefined1 *)((long)pvVar3 + param_2) = uVar4;
  return pvVar3;
}

Assistant:

static void* allocate(Purpose, thread_info_base* this_thread,
      std::size_t size)
  {
    std::size_t chunks = (size + chunk_size - 1) / chunk_size;

    if (this_thread && this_thread->reusable_memory_[Purpose::mem_index])
    {
      void* const pointer = this_thread->reusable_memory_[Purpose::mem_index];
      this_thread->reusable_memory_[Purpose::mem_index] = 0;

      unsigned char* const mem = static_cast<unsigned char*>(pointer);
      if (static_cast<std::size_t>(mem[0]) >= chunks)
      {
        mem[size] = mem[0];
        return pointer;
      }

      ::operator delete(pointer);
    }

    void* const pointer = ::operator new(chunks * chunk_size + 1);
    unsigned char* const mem = static_cast<unsigned char*>(pointer);
    mem[size] = (chunks <= UCHAR_MAX) ? static_cast<unsigned char>(chunks) : 0;
    return pointer;
  }